

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

monst * beam_hit(int ddx,int ddy,int range,int weapon,_func_int_monst_ptr_obj_ptr *fhitm,
                _func_int_obj_ptr_obj_ptr *fhito,obj *obj,boolean *obj_destroyed)

{
  ushort uVar1;
  xchar x_00;
  xchar y;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  monst *pmVar6;
  undefined8 extraout_RAX;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  trap *ptVar10;
  char cVar11;
  byte bVar12;
  undefined4 in_register_0000003c;
  undefined8 uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int x;
  int local_84;
  int local_80;
  undefined4 local_7c;
  byte local_75;
  uint local_74;
  ulong local_70;
  monst *local_68;
  ulong local_60;
  undefined8 local_58;
  uint local_4c;
  undefined8 local_48;
  _func_int_monst_ptr_obj_ptr *local_40;
  _func_int_obj_ptr_obj_ptr *local_38;
  
  uVar13 = CONCAT44(in_register_0000003c,ddx);
  uVar15 = (ulong)(uint)weapon;
  uVar16 = (ulong)(uint)ddy;
  if (obj_destroyed != (boolean *)0x0) {
    *obj_destroyed = '\0';
  }
  if (weapon == 2) {
    local_58._0_1_ = (char)ddx;
    bhitpos.x = u.ux + (char)local_58;
    bhitpos.y = u.uy + (char)ddy;
    range = range + -1;
  }
  else {
    bhitpos.x = u.ux;
    bhitpos.y = u.uy;
  }
  local_58 = uVar13;
  local_40 = fhitm;
  local_38 = fhito;
  if (weapon == 3) {
    iVar4 = -1;
    iVar14 = 0x40002;
  }
  else {
    if ((weapon & 0xfffffffbU) == 0) goto LAB_00294c0f;
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      iVar14 = (int)obj->otyp;
    }
    else {
      iVar14 = display_rng(0x219);
      iVar14 = iVar14 + 1;
    }
    iVar14 = iVar14 + 1;
    iVar4 = -4;
  }
  tmp_at(iVar4,iVar14);
LAB_00294c0f:
  local_4c = weapon - 1;
  local_7c = (undefined4)CONCAT71((uint7)(uint3)(local_4c >> 8),1);
  local_48 = 0;
  local_70 = uVar16;
  local_60 = uVar15;
  do {
    if (range < 1) goto LAB_002958b4;
    iVar14 = range + -1;
    cVar11 = (char)local_58 + bhitpos.x;
    bVar12 = bhitpos.y + (char)uVar16;
    local_80 = (int)cVar11;
    local_84 = (int)(char)bVar12;
    if ((byte)(cVar11 - 1U) < 0x4f && bVar12 < 0x15) {
      bhitpos.x = cVar11;
      bhitpos.y = bVar12;
      if ((((byte)(obj->oclass | 4U) == 6) && (objects[obj->otyp].oc_subtyp == '\x04')) &&
         (cVar11 = inside_shop(level,cVar11,bVar12), cVar11 != '\0')) {
        pmVar6 = shkcatch(obj,(xchar)local_80,(xchar)local_84);
        if (pmVar6 == (monst *)0x0) goto LAB_00294d05;
        tmp_at(-6,0);
        iVar4 = 1;
        uVar15 = local_60;
        range = iVar14;
        local_68 = pmVar6;
      }
      else {
LAB_00294d05:
        iVar5 = local_80;
        iVar4 = local_84;
        bVar12 = level->locations[bhitpos.x][bhitpos.y].typ;
        if ((local_4c < 2) && (bVar12 == 0x16)) {
          uVar3 = 0;
          if ((char)local_7c == '\0') {
            uVar3 = mt_random();
            uVar3 = (uint)(uVar3 * -0x33333333 < 0x33333334);
          }
          uVar16 = local_70;
          bVar2 = hits_bars(&obj,iVar5 - (int)local_58,iVar4 - (int)local_70,(int)local_58,
                            (int)local_70,uVar3,1);
          if (bVar2 != '\0') {
            if ((obj_destroyed != (boolean *)0x0) && (obj == (obj *)0x0)) {
              *obj_destroyed = '\x01';
            }
            bhitpos.x = bhitpos.x - (char)local_58;
            bhitpos.y = bhitpos.y - (char)uVar16;
            iVar4 = 3;
            uVar15 = local_60;
            range = iVar14;
            goto LAB_00295258;
          }
        }
        uVar15 = local_60;
        local_74 = (uint)bVar12;
        iVar4 = (int)local_60;
        local_75 = bVar12;
        if ((iVar4 == 0) && (bVar2 = find_drawbridge(&local_80,&local_84), bVar2 != '\0')) {
          uVar1 = obj->otyp;
          if (uVar1 < 0x1c4) {
            if (uVar1 == 0x186) {
LAB_00295067:
              bVar2 = is_db_wall((int)bhitpos.x,(int)bhitpos.y);
              if (bVar2 != '\0') {
                if (((viz_array[local_84][local_80] & 2U) != 0) ||
                   ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) {
                  discover_object((int)obj->otyp,'\x01','\x01');
                }
                open_drawbridge(local_80,local_84);
              }
            }
            else {
              if (uVar1 == 0x187) goto LAB_00295100;
              if (uVar1 == 0x18c) goto LAB_00295138;
            }
          }
          else if (uVar1 == 0x1c4) {
LAB_00295100:
            if (local_74 == 0xc) {
              destroy_drawbridge(local_80,local_84);
              discover_object((int)obj->otyp,'\x01','\x01');
            }
          }
          else if (uVar1 == 0x1cd) {
LAB_00295138:
            if ((((viz_array[local_84][local_80] & 2U) != 0) ||
                ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) &&
               (level->locations[local_80][local_84].typ == '$')) {
              discover_object((int)(short)uVar1,'\x01','\x01');
            }
            bVar2 = close_drawbridge(local_80,local_84);
            if (bVar2 == '\0') {
              iVar4 = 1;
              local_68 = (monst *)0x0;
              range = iVar14;
              goto LAB_00295258;
            }
          }
          else if (uVar1 == 0x1cc) goto LAB_00295067;
        }
        uVar3 = local_74;
        pmVar6 = level->monsters[bhitpos.x][bhitpos.y];
        if (pmVar6 == (monst *)0x0) {
          pmVar6 = (monst *)0x0;
        }
        else if ((pmVar6->field_0x61 & 2) != 0) {
          pmVar6 = (monst *)0x0;
        }
        if (pmVar6 == (monst *)0x0) {
          if (((iVar4 == 0) && (obj->otyp == 0x1ce)) &&
             ((level->locations[bhitpos.x][bhitpos.y].field_0x6 & 8) != 0)) {
            unmap_object((int)bhitpos.x,(int)bhitpos.y);
            newsym(local_80,local_84);
          }
LAB_00294f2c:
          poVar7 = obj;
          y = bhitpos.y;
          x_00 = bhitpos.x;
          if (local_38 == (_func_int_obj_ptr_obj_ptr *)0x0) {
            if (iVar4 == 2) {
              if ((obj->oclass != '\f') || (level->objects[bhitpos.x][bhitpos.y] == (obj *)0x0)) {
                bVar2 = costly_spot(bhitpos.x,bhitpos.y);
                bVar2 = ship_object(poVar7,x_00,y,bVar2);
                uVar15 = local_60;
                uVar3 = local_74;
                if (bVar2 == '\0') goto LAB_00295218;
              }
              tmp_at(-6,0);
              local_68 = (monst *)0x0;
              uVar15 = local_60;
              pmVar6 = local_68;
              goto LAB_00295794;
            }
          }
          else {
            iVar4 = bhitpile(obj,local_38,(int)bhitpos.x,(int)bhitpos.y);
            iVar14 = iVar14 + -1 + (uint)(iVar4 == 0);
          }
LAB_00295218:
          uVar16 = local_70;
          iVar5 = (int)uVar15;
          if ((iVar5 == 0) && ((uVar3 == 0x17 || (uVar3 == 0xf)))) {
            uVar3 = (ushort)obj->otyp - 0x186;
            if ((((uVar3 < 0x3f) && ((0x4000000000000043U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) ||
                ((ushort)obj->otyp - 0x1cc < 2)) &&
               (bVar2 = doorlock(obj,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
              if (((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) || (obj->otyp == 0x1c4)) {
                discover_object((int)obj->otyp,'\x01','\x01');
              }
              if (((*(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0x1f0) == 0x10) &&
                 (pcVar8 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar8 != '\0')) {
                add_damage(bhitpos.x,bhitpos.y,400);
                local_48 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
            }
          }
          if ((local_75 < 0x11) ||
             (bVar2 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
            bhitpos.x = bhitpos.x - (char)local_58;
            bhitpos.y = bhitpos.y - (char)uVar16;
            goto LAB_00295252;
          }
          if ((uVar15 & 0xfffffffb) == 0) {
LAB_0029545c:
            if ((iVar5 == 1) && ((0 < iVar14 && (local_7c = 0, obj->otyp == 0x216)))) {
              poVar7 = sobj_at(0x214,level,local_80,local_84);
              uVar15 = local_60;
              if (poVar7 != (obj *)0x0) {
                local_7c = 0;
                if ((viz_array[local_84][local_80] & 2U) != 0) {
                  pcVar8 = distant_name(obj,xname);
                  pcVar8 = The(pcVar8);
                  pcVar9 = xname(poVar7);
                  pcVar9 = an(pcVar9);
                  uVar16 = local_70;
                  local_7c = 0;
                  pline("%s hits %s.",pcVar8,pcVar9);
                }
                iVar4 = 0;
                range = 0;
                uVar15 = local_60;
                goto LAB_00295258;
              }
              local_7c = 0;
              if (obj == uball) {
                bVar2 = test_move(local_80 - (int)local_58,local_84 - (int)uVar16,(int)local_58,
                                  (int)uVar16,0,1);
                if (bVar2 == '\0') {
                  local_7c = 0;
                  if ((viz_array[local_84][local_80] & 2U) != 0) {
                    pcVar8 = distant_name(obj,xname);
                    The(pcVar8);
                    local_7c = 0;
                    pline("%s jerks to an abrupt halt.");
                  }
                  iVar4 = 0;
                  range = 0;
                  goto LAB_00295258;
                }
                local_7c = 0;
                if (((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
                    (ptVar10 = t_at(level,local_80,local_84), ptVar10 != (trap *)0x0)) &&
                   ((byte)((ptVar10->field_0x8 & 0x1f) - 0xb) < 4)) {
                  iVar14 = 0;
                }
              }
            }
            local_7c = 0;
            iVar4 = 0;
            range = iVar14;
          }
          else {
            if (((level->locations[bhitpos.x][bhitpos.y].field_0x6 & 8) != 0) &&
               ((viz_array[local_84][local_80] & 2U) != 0)) {
              unmap_object((int)bhitpos.x,(int)bhitpos.y);
              newsym(local_80,local_84);
            }
            tmp_at((int)bhitpos.x,(int)bhitpos.y);
            (*windowprocs.win_delay)();
            range = iVar14;
            if (iVar5 == 2) {
              bVar2 = is_pool(level,(int)bhitpos.x,(int)bhitpos.y);
              iVar4 = 3;
              if (bVar2 == '\0') {
                bVar2 = is_lava(level,(int)bhitpos.x,(int)bhitpos.y);
                if ((bVar2 == '\0') && (local_74 != 0x1f)) goto LAB_0029545c;
              }
            }
            else if ((iVar5 == 3) || (iVar4 = 3, local_75 != 0x1f)) goto LAB_0029545c;
          }
        }
        else {
          notonhead = true;
          if (bhitpos.x == pmVar6->mx) {
            notonhead = bhitpos.y != pmVar6->my;
          }
          if (iVar4 == 0) {
            (*local_40)(pmVar6,obj);
            iVar14 = range + -4;
            uVar3 = local_74;
            goto LAB_00294f2c;
          }
          if (iVar4 == 3) {
            if ((pmVar6->field_0x60 & 2) != 0) {
              obj->ox = u.ux;
              obj->oy = u.uy;
              flash_hits_mon(pmVar6,obj);
              goto LAB_00294f2c;
            }
            tmp_at(-6,0);
          }
          else {
            if (iVar4 != 4) {
              tmp_at(-6,0);
            }
            if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
              if (pmVar6->wormno == '\0') {
                if (((viz_array[pmVar6->my][pmVar6->mx] & 2U) != 0) ||
                   (((((u.uprops[0x1e].intrinsic == 0 &&
                       ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                    (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                     (((viz_array[pmVar6->my][pmVar6->mx] & 1U) != 0 &&
                      ((pmVar6->data->mflags3 & 0x200) != 0)))))))) goto LAB_002955a6;
              }
              else {
                bVar2 = worm_known(level,pmVar6);
                if (bVar2 != '\0') {
LAB_002955a6:
                  uVar3 = *(uint *)&pmVar6->field_0x60;
                  if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar3 & 0x280) == 0) goto LAB_002955f5;
                  }
                  else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_002955f5:
                    if ((u._1052_1_ & 0x20) == 0) goto LAB_00295794;
                  }
                }
              }
              if (((((pmVar6->data->mflags1 & 0x10000) != 0) ||
                   ((poVar7 = which_armor(pmVar6,4), poVar7 != (obj *)0x0 &&
                    (poVar7 = which_armor(pmVar6,4), poVar7->otyp == 0x4f)))) ||
                  ((((u.uprops[0x1e].intrinsic == 0 &&
                     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                    (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                     ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                       (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                       youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                   (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                    (iVar5 = dist2((int)pmVar6->mx,(int)pmVar6->my,(int)u.ux,(int)u.uy),
                    0x40 < iVar5)))))) &&
                 (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                  (bVar2 = match_warn_of_mon(pmVar6), bVar2 == '\0')))) {
                uVar3 = local_74;
                if (iVar4 == 4) goto LAB_00294f2c;
                map_invisible(bhitpos.x,bhitpos.y);
              }
            }
          }
LAB_00295794:
          local_68 = pmVar6;
          iVar4 = 1;
          uVar16 = local_70;
          range = iVar14;
        }
      }
    }
    else {
LAB_00295252:
      iVar4 = 3;
      range = iVar14;
    }
LAB_00295258:
  } while (iVar4 == 0);
  if (iVar4 == 3) {
LAB_002958b4:
    if ((uVar15 & 0xfffffffb) != 0) {
      tmp_at(-6,0);
    }
    if ((char)local_48 == '\0') {
      local_68 = (monst *)0x0;
    }
    else {
      pay_for_damage("destroy",'\0');
      local_68 = (monst *)0x0;
    }
  }
  return local_68;
}

Assistant:

struct monst *beam_hit(int ddx, int ddy, int range,	/* direction and range */
		   int weapon,			/* see values in hack.h */
		   int (*fhitm)(struct monst*, struct obj*),/* fns called when mon/obj hit */
		   int (*fhito)(struct obj*, struct obj*),
		   struct obj *obj,/* object tossed/used */
		   boolean *obj_destroyed)/* has object been deallocated? may be NULL */
{
	struct monst *mtmp;
	uchar typ;
	boolean shopdoor = FALSE, point_blank = TRUE;
	if (obj_destroyed) *obj_destroyed = FALSE;

	if (weapon == KICKED_WEAPON) {
	    /* object starts one square in front of player */
	    bhitpos.x = u.ux + ddx;
	    bhitpos.y = u.uy + ddy;
	    range--;
	} else {
	    bhitpos.x = u.ux;
	    bhitpos.y = u.uy;
	}

	if (weapon == FLASHED_LIGHT) {
	    tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_flashbeam));
	} else if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM)
	    tmp_at(DISP_OBJECT, dbuf_objid(obj));

	while (range-- > 0) {
	    int x,y;

	    bhitpos.x += ddx;
	    bhitpos.y += ddy;
	    x = bhitpos.x; y = bhitpos.y;

	    if (!isok(x, y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (is_pick(obj) && inside_shop(level, x, y) &&
					   (mtmp = shkcatch(obj, x, y))) {
		tmp_at(DISP_END, 0);
		return mtmp;
	    }

	    typ = level->locations[bhitpos.x][bhitpos.y].typ;

	    /* iron bars will block anything big enough */
	    if ((weapon == THROWN_WEAPON || weapon == KICKED_WEAPON) &&
		    typ == IRONBARS &&
		    hits_bars(&obj, x - ddx, y - ddy, ddx, ddy,
			      point_blank ? 0 : !rn2(5), 1)) {
		/* caveat: obj might now be null... */
		if (obj == NULL && obj_destroyed) *obj_destroyed = TRUE;
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (weapon == ZAPPED_WAND && find_drawbridge(&x,&y)) {
		switch (obj->otyp) {
		    case WAN_OPENING:
		    case SPE_KNOCK:
			if (is_db_wall(bhitpos.x, bhitpos.y)) {
			    if (cansee(x,y) || cansee(bhitpos.x,bhitpos.y))
				makeknown(obj->otyp);
			    open_drawbridge(x,y);
			}
			break;
		    case WAN_LOCKING:
		    case SPE_WIZARD_LOCK:
			if ((cansee(x,y) || cansee(bhitpos.x, bhitpos.y))
			    && level->locations[x][y].typ == DRAWBRIDGE_DOWN)
			    makeknown(obj->otyp);
			if (!close_drawbridge(x, y)) {
			    /* Stop the ray to prevent a door being made
			     * in the drawbridge's doorway.
			     */
			    return NULL;
			}
			break;
		    case WAN_STRIKING:
		    case SPE_FORCE_BOLT:
			/* destroy closed drawbridges, not open ones */
			if (typ == DBWALL) {
			    destroy_drawbridge(x,y);
			    makeknown(obj->otyp);
			}
			break;
		}
	    }

	    if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
		notonhead = (bhitpos.x != mtmp->mx ||
			     bhitpos.y != mtmp->my);
		if (weapon != FLASHED_LIGHT) {
			if (weapon != ZAPPED_WAND) {
			    if (weapon != INVIS_BEAM) tmp_at(DISP_END, 0);
			    if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp)) {
				if (weapon != INVIS_BEAM) {
				    map_invisible(bhitpos.x, bhitpos.y);
				    return mtmp;
				}
			    } else
				return mtmp;
			}
			if (weapon != INVIS_BEAM) {
			    (*fhitm)(mtmp, obj);
			    range -= 3;
			}
		} else {
		    /* FLASHED_LIGHT hitting invisible monster
		       should pass through instead of stop so
		       we call flash_hits_mon() directly rather
		       than returning mtmp back to caller. That
		       allows the flash to keep on going. Note
		       that we use mtmp->minvis not canspotmon()
		       because it makes no difference whether
		       the hero can see the monster or not.*/
		    if (mtmp->minvis) {
			obj->ox = u.ux,  obj->oy = u.uy;
			flash_hits_mon(mtmp, obj);
		    } else {
			tmp_at(DISP_END, 0);
		    	return mtmp; 	/* caller will call flash_hits_mon */
		    }
		}
	    } else {
		if (weapon == ZAPPED_WAND && obj->otyp == WAN_PROBING &&
		    level->locations[bhitpos.x][bhitpos.y].mem_invis) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
	    }
	    if (fhito) {
		if (bhitpile(obj,fhito,bhitpos.x,bhitpos.y))
		    range--;
	    } else {
		if (weapon == KICKED_WEAPON &&
		      ((obj->oclass == COIN_CLASS &&
			 OBJ_AT(bhitpos.x, bhitpos.y)) ||
			    ship_object(obj, bhitpos.x, bhitpos.y,
					costly_spot(bhitpos.x, bhitpos.y)))) {
			tmp_at(DISP_END, 0);
			return NULL;
		}
	    }
	    if (weapon == ZAPPED_WAND && (IS_DOOR(typ) || typ == SDOOR)) {
		switch (obj->otyp) {
		case WAN_OPENING:
		case WAN_LOCKING:
		case WAN_STRIKING:
		case SPE_KNOCK:
		case SPE_WIZARD_LOCK:
		case SPE_FORCE_BOLT:
		    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y) ||
			    (obj->otyp == WAN_STRIKING))
			    makeknown(obj->otyp);
			if (level->locations[bhitpos.x][bhitpos.y].doormask == D_BROKEN
			    && *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE)) {
			    shopdoor = TRUE;
			    add_damage(bhitpos.x, bhitpos.y, 400L);
			}
		    }
		    break;
		}
	    }
	    if (!ZAP_POS(typ) || closed_door(level, bhitpos.x, bhitpos.y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }
	    if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) {
		/* 'I' present but no monster: erase */
		/* do this before the tmp_at() */
		if (level->locations[bhitpos.x][bhitpos.y].mem_invis
			&& cansee(x, y)) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		/* kicked objects fall in pools */
		if ((weapon == KICKED_WEAPON) &&
		   (is_pool(level, bhitpos.x, bhitpos.y) ||
		   is_lava(level, bhitpos.x, bhitpos.y)))
		    break;
		if (IS_SINK(typ) && weapon != FLASHED_LIGHT)
		    break;	/* physical objects fall onto sink */
	    }
	    /* limit range of ball so hero won't make an invalid move */
	    if (weapon == THROWN_WEAPON && range > 0 &&
		obj->otyp == HEAVY_IRON_BALL) {
		struct obj *bobj;
		struct trap *t;
		if ((bobj = sobj_at(BOULDER, level, x, y)) != 0) {
		    if (cansee(x,y))
			pline("%s hits %s.",
			      The(distant_name(obj, xname)), an(xname(bobj)));
		    range = 0;
		} else if (obj == uball) {
		    if (!test_move(x - ddx, y - ddy, ddx, ddy, 0, TEST_MOVE)) {
			/* nb: it didn't hit anything directly */
			if (cansee(x,y))
			    pline("%s jerks to an abrupt halt.",
				  The(distant_name(obj, xname))); /* lame */
			range = 0;
		    } else if (In_sokoban(&u.uz) && (t = t_at(level, x, y)) != 0 &&
			       (t->ttyp == PIT || t->ttyp == SPIKED_PIT ||
				t->ttyp == HOLE || t->ttyp == TRAPDOOR)) {
			/* hero falls into the trap, so ball stops */
			range = 0;
		    }
		}
	    }

	    /* thrown/kicked missile has moved away from its starting spot */
	    point_blank = FALSE;	/* affects passing through iron bars */
	}

	if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) tmp_at(DISP_END, 0);

	if (shopdoor)
	    pay_for_damage("destroy", FALSE);

	return NULL;
}